

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int l_hashfloat(lua_Number n)

{
  double dVar1;
  uint local_30;
  uint u;
  lua_Integer ni;
  lua_Number lStack_18;
  int i;
  lua_Number n_local;
  
  lStack_18 = n;
  dVar1 = frexp(n,(int *)((long)&ni + 4));
  dVar1 = dVar1 * 2147483648.0;
  if ((dVar1 < -9.223372036854776e+18) || (9.223372036854776e+18 <= dVar1)) {
    n_local._4_4_ = 0;
  }
  else {
    local_30 = ni._4_4_ + (int)(long)dVar1;
    if (0x7fffffff < local_30) {
      local_30 = local_30 ^ 0xffffffff;
    }
    n_local._4_4_ = local_30;
  }
  return n_local._4_4_;
}

Assistant:

static int l_hashfloat (lua_Number n) {
  int i;
  lua_Integer ni;
  n = l_mathop(frexp)(n, &i) * -cast_num(INT_MIN);
  if (!lua_numbertointeger(n, &ni)) {  /* is 'n' inf/-inf/NaN? */
    lua_assert(luai_numisnan(n) || l_mathop(fabs)(n) == cast_num(HUGE_VAL));
    return 0;
  }
  else {  /* normal case */
    unsigned int u = cast_uint(i) + cast_uint(ni);
    return cast_int(u <= cast_uint(INT_MAX) ? u : ~u);
  }
}